

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.h
# Opt level: O2

Analysis __thiscall
spvtools::opt::CopyPropagateArrays::GetPreservedAnalyses(CopyPropagateArrays *this)

{
  return kAnalysisTypes|kAnalysisConstants|kAnalysisNameMap|kAnalysisLoopAnalysis|
         kAnalysisDominatorAnalysis|kAnalysisCFG|kAnalysisDecorations|kAnalysisInstrToBlockMapping|
         kAnalysisBegin;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse | IRContext::kAnalysisCFG |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisDecorations |
           IRContext::kAnalysisDominatorAnalysis | IRContext::kAnalysisNameMap |
           IRContext::kAnalysisConstants | IRContext::kAnalysisTypes;
  }